

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int CVmObjBigNum::read_from_data_file(vm_val_t *retval,CVmDataSource *fp)

{
  int iVar1;
  vm_obj_id_t obj;
  CVmObject *this;
  char *pcVar2;
  size_t sVar3;
  long *in_RSI;
  vm_val_t *in_RDI;
  CVmObjBigNum *bignum;
  size_t prec;
  char buf [16];
  size_t in_stack_ffffffffffffffa8;
  undefined1 local_28 [16];
  long *local_18;
  vm_val_t *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_28,2);
  if (iVar1 == 0) {
    iVar1 = ::osrp2(local_28);
    obj = create((int)((ulong)local_10 >> 0x20),in_stack_ffffffffffffffa8);
    vm_val_t::set_obj(local_10,obj);
    this = vm_objp(0);
    pcVar2 = get_ext((CVmObjBigNum *)this);
    sVar3 = calc_alloc((long)iVar1);
    iVar1 = (**(code **)(*local_18 + 0x10))(local_18,pcVar2,sVar3);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmObjBigNum::read_from_data_file(VMG_ vm_val_t *retval, CVmDataSource *fp)
{
    char buf[16];
    size_t prec;
    CVmObjBigNum *bignum;

    /* read the precision */
    if (fp->read(buf, 2))
        return 1;
    prec = osrp2(buf);

    /* create a BigNumber with the required precision */
    retval->set_obj(create(vmg_ FALSE, prec));
    bignum = (CVmObjBigNum *)vm_objp(vmg_ retval->val.obj);

    /* read the bytes into the new object's extension */
    if (fp->read(bignum->get_ext(), calc_alloc(prec)))
        return 1;

    /* success */
    return 0;
}